

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall
CTcTokenizer::log_error_or_warning_with_tok
          (CTcTokenizer *this,tc_severity_t sev,int errnum,CTcToken *tok)

{
  tc_toktyp_t tVar1;
  wchar_t wVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  CTcTokFileDesc *linedesc;
  long linenum;
  CTcToken *in_RCX;
  uint in_EDX;
  uint in_ESI;
  CTcTokenizer *in_RDI;
  size_t outchars;
  size_t rem;
  utf8_ptr dst;
  utf8_ptr src;
  char *suffix;
  char *prefix;
  char buf [128];
  size_t tok_len;
  char *tok_txt;
  undefined8 in_stack_fffffffffffffee8;
  utf8_ptr *in_stack_fffffffffffffef0;
  CTcMain *this_00;
  size_t *in_stack_fffffffffffffef8;
  utf8_ptr *in_stack_ffffffffffffff00;
  ulong local_d8;
  utf8_ptr local_c8;
  utf8_ptr local_c0;
  char *local_b8;
  char *local_b0;
  char local_a8 [80];
  size_t local_28;
  char *local_20;
  
  utf8_ptr::utf8_ptr(&local_c0);
  utf8_ptr::utf8_ptr(&local_c8);
  tVar1 = CTcToken::gettyp(in_RCX);
  switch(tVar1) {
  case TOKT_EOF:
    local_20 = "<End Of File>";
    local_28 = strlen("<End Of File>");
    goto LAB_002efbbe;
  default:
    local_20 = CTcToken::get_text(in_RCX);
    local_28 = CTcToken::get_text_len(in_RCX);
    goto LAB_002efbbe;
  case TOKT_SSTR:
    local_b0 = "\'";
    local_b8 = "\'";
    break;
  case TOKT_DSTR:
    local_b0 = "\"";
    local_b8 = "\"";
    break;
  case TOKT_DSTR_START:
    local_b0 = "\"";
    local_b8 = "<<";
    break;
  case TOKT_DSTR_MID:
    local_b0 = ">>";
    local_b8 = "<<";
    break;
  case TOKT_DSTR_END:
    local_b0 = ">>";
    local_b8 = "\"";
    break;
  case TOKT_RESTR:
    local_b0 = "R\'";
    local_b8 = "\'";
  }
  strcpy(local_a8,local_b0);
  pcVar3 = CTcToken::get_text(in_RCX);
  utf8_ptr::set(&local_c0,pcVar3);
  sVar4 = CTcToken::get_text_len(in_RCX);
  sVar5 = strlen(local_a8);
  utf8_ptr::set(&local_c8,local_a8 + sVar5);
  for (local_d8 = 0; wVar2 = (wchar_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
      sVar4 != 0 && local_d8 < 0x14; local_d8 = local_d8 + 1) {
    wVar2 = utf8_ptr::getch((utf8_ptr *)0x2ef944);
    if (wVar2 < L' ') {
      utf8_ptr::setch(in_stack_fffffffffffffef0,(wchar_t)((ulong)in_stack_fffffffffffffee8 >> 0x20))
      ;
      wVar2 = utf8_ptr::getch((utf8_ptr *)0x2ef966);
      in_stack_ffffffffffffff00 = (utf8_ptr *)(ulong)(uint)(wVar2 + L'\xfffffff7');
      wVar2 = (wchar_t)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      switch(in_stack_ffffffffffffff00) {
      case (utf8_ptr *)0x0:
        utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
        break;
      case (utf8_ptr *)0x1:
        utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
        break;
      case (utf8_ptr *)0x2:
        utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
        break;
      default:
        utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
        wVar2 = utf8_ptr::getch((utf8_ptr *)0x2efa33);
        int_to_xdigit(wVar2 >> 0xc & 0xf);
        utf8_ptr::setch(in_stack_fffffffffffffef0,
                        (wchar_t)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        wVar2 = utf8_ptr::getch((utf8_ptr *)0x2efa5a);
        int_to_xdigit(wVar2 >> 8 & 0xf);
        utf8_ptr::setch(in_stack_fffffffffffffef0,
                        (wchar_t)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        wVar2 = utf8_ptr::getch((utf8_ptr *)0x2efa81);
        int_to_xdigit(wVar2 >> 4 & 0xf);
        utf8_ptr::setch(in_stack_fffffffffffffef0,
                        (wchar_t)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        wVar2 = utf8_ptr::getch((utf8_ptr *)0x2efaa8);
        int_to_xdigit(wVar2 & 0xf);
        utf8_ptr::setch(in_stack_fffffffffffffef0,
                        (wchar_t)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        break;
      case (utf8_ptr *)0x4:
        utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
        break;
      case (utf8_ptr *)0x5:
        utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
        break;
      case (utf8_ptr *)0x6:
        utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
        break;
      case (utf8_ptr *)0xc:
        utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
      }
    }
    else {
      utf8_ptr::getch((utf8_ptr *)0x2eface);
      utf8_ptr::setch(in_stack_fffffffffffffef0,(wchar_t)((ulong)in_stack_fffffffffffffee8 >> 0x20))
      ;
    }
    utf8_ptr::inc(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  if (sVar4 != 0) {
    utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
    utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
    utf8_ptr::setch(in_stack_fffffffffffffef0,wVar2);
  }
  pcVar3 = utf8_ptr::getptr(&local_c8);
  strcpy(pcVar3,local_b8);
  local_20 = local_a8;
  local_28 = strlen(local_20);
LAB_002efbbe:
  this_00 = G_tcmain;
  linedesc = get_last_desc(in_RDI);
  linenum = get_last_linenum(in_RDI);
  CTcMain::log_error(this_00,linedesc,linenum,(tc_severity_t)(ulong)in_ESI,(int)(ulong)in_EDX,
                     local_28,local_20);
  return;
}

Assistant:

void CTcTokenizer::log_error_or_warning_with_tok(
    tc_severity_t sev, int errnum, const CTcToken *tok)
{
    const char *tok_txt;
    size_t tok_len;
    char buf[128];
    const char *prefix;
    const char *suffix;
    utf8_ptr src;
    utf8_ptr dst;
    size_t rem;
    size_t outchars;

    /* see what we have */
    switch(tok->gettyp())
    {
    case TOKT_SSTR:
        /* show the string in quotes, but limit the length */
        prefix = "'";
        suffix = "'";
        goto format_string;

    case TOKT_DSTR:
        prefix = "\"";
        suffix = "\"";
        goto format_string;
        
    case TOKT_DSTR_START:
        prefix = "\"";
        suffix = "<<";
        goto format_string;
        
    case TOKT_DSTR_MID:
        prefix = ">>";
        suffix = "<<";
        goto format_string;

    case TOKT_DSTR_END:
        prefix = ">>";
        suffix = "\"";
        goto format_string;

    case TOKT_RESTR:
        prefix = "R'";
        suffix = "'";
        goto format_string;

    format_string:
        /* set the prefix */
        strcpy(buf, prefix);
        
        /* 
         *   show the string, but limit the length, and convert control
         *   characters to escaped representation 
         */
        src.set((char *)tok->get_text());
        rem = tok->get_text_len();
        for (dst.set(buf  + strlen(buf)), outchars = 0 ;
             rem != 0 && outchars < 20 ; src.inc(&rem), ++outchars)
        {
            /* if this is a control character, escape it */
            if (src.getch() < 32)
            {
                dst.setch('\\');
                
                switch(src.getch())
                {
                case 10:
                    dst.setch('n');
                    break;

                case 13:
                    dst.setch('r');
                    break;

                case 0x000F:
                    dst.setch('^');
                    break;

                case 0x000E:
                    dst.setch('v');
                    break;

                case 0x000B:
                    dst.setch('b');
                    break;

                case 0x0015:
                    dst.setch(' ');
                    break;

                case 9:
                    dst.setch('t');
                    break;

                default:
                    dst.setch('x');
                    dst.setch('0' + int_to_xdigit((src.getch() >> 12) & 0xf));
                    dst.setch('0' + int_to_xdigit((src.getch() >> 8) & 0xf));
                    dst.setch('0' + int_to_xdigit((src.getch() >> 4) & 0xf));
                    dst.setch('0' + int_to_xdigit((src.getch()) & 0xf));
                    break;
                }
            }
            else
            {
                /* put this character as-is */
                dst.setch(src.getch());
            }
        }

        /* if there's more string left, add "..." */
        if (rem != 0)
        {
            dst.setch('.');
            dst.setch('.');
            dst.setch('.');
        }

        /* add the suffix */
        strcpy(dst.getptr(), suffix);

        /* use this buffer as the token string to display */
        tok_txt = buf;
        tok_len = strlen(tok_txt);
        break;

    case TOKT_EOF:
        /* show a special "<End Of File>" marker */
        tok_txt = "<End Of File>";
        tok_len = strlen(tok_txt);
        break;
        
    default:
        /* just show the current token text */
        tok_txt = tok->get_text();
        tok_len = tok->get_text_len();
        break;
    }
    
    /* log the error */
    G_tcmain->log_error(get_last_desc(), get_last_linenum(),
                        sev, errnum, tok_len, tok_txt);
}